

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testlab10.c
# Opt level: O0

int FeederBigSegment(void)

{
  DWORD DVar1;
  int iVar2;
  DWORD DVar3;
  uint uVar4;
  FILE *__stream;
  uint local_28;
  uint local_24;
  int y;
  int x;
  int i;
  DWORD t;
  FILE *in;
  
  __stream = fopen("in.txt","w");
  if (__stream == (FILE *)0x0) {
    printf("can\'t create in.txt. No space on disk?\n");
    in._4_4_ = -1;
  }
  else {
    printf("Creating big segment... ");
    fflush(_stdout);
    DVar1 = GetTickCount();
    fprintf(__stream,"%d\n",100000);
    for (y = 99999; -1 < y; y = y + -1) {
      local_24 = 0;
      local_28 = 0;
      if (bigSegmentsN != 2) {
        local_24 = y;
      }
      if (bigSegmentsN != 1) {
        local_28 = y;
      }
      iVar2 = fprintf(__stream,"%d %d\n",(ulong)local_24,(ulong)local_28);
      if (iVar2 < 2) {
        fclose(__stream);
        printf("%s\n","can\'t create in.txt. No space on disk?\n");
        return -1;
      }
    }
    DVar3 = GetTickCount();
    uVar4 = RoundUptoThousand(DVar3 - DVar1);
    printf("done in T=%u seconds. Starting exe with timeout 2*T+2... ",(ulong)uVar4 / 1000,
           (ulong)uVar4 % 1000);
    LabTimeout = uVar4 * 2 + 2000;
    LabMemoryLimit = 0x649f00;
    fflush(_stdout);
    fclose(__stream);
    in._4_4_ = 0;
  }
  return in._4_4_;
}

Assistant:

static int FeederBigSegment(void)
{
    FILE *const in = fopen("in.txt", "w");
    if (!in) {
        printf("can't create in.txt. No space on disk?\n");
        return -1;
    }

    printf("Creating big segment... ");
    fflush(stdout);
    DWORD t = GetTickCount();
    fprintf(in, "%d\n", MAX_POINT_COUNT);

    for (int i = MAX_POINT_COUNT - 1; i >= 0; --i) {
        int x = 0;
        int y = 0;

        if (bigSegmentsN != 2) {
            x = i;
        }
        if (bigSegmentsN != 1) {
            y = i;
        }
        
        if (fprintf(in, "%d %d\n", x, y) < 2) {
                fclose(in);
                printf("%s\n", "can't create in.txt. No space on disk?\n");
                return -1;
            }
    }

    t = RoundUptoThousand(GetTickCount() - t);
    printf("done in T=%u seconds. Starting exe with timeout 2*T+2... ", (unsigned)t/1000);
    LabTimeout = (int)t*2+2000;
    LabMemoryLimit = MIN_PROCESS_RSS_BYTES + 3*sizeof(TPoint)*MAX_POINT_COUNT;
    fflush(stdout);
    fclose(in);

    return 0;    
}